

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

void __thiscall mjs::string::string(string *this,gc_heap *h,string_view *s)

{
  gc_heap_ptr_untyped local_20;
  
  gc_string::make<char>((gc_string *)&local_20,h,s);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,&local_20);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_20);
  return;
}

Assistant:

explicit string(gc_heap& h, const std::string_view& s) : gc_heap_ptr<gc_string>(gc_string::make(h, s)) {}